

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeMemoryFill(TranslateToFuzzReader *this)

{
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var1;
  uintptr_t uVar2;
  uintptr_t uVar3;
  Expression *pEVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  
  if (this->allowMemory != false) {
    pEVar4 = makePointer(this);
    pEVar5 = make(this,(Type)0x2);
    pEVar6 = make(this,(Type)*(uintptr_t *)
                              ((long)(((this->wasm->memories).
                                       super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                              + 0x50));
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    uVar2 = *(uintptr_t *)
             _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uVar3 = *(uintptr_t *)
             ((long)_Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                    _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar7 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x38,8);
    *(undefined8 *)pEVar7 = 0;
    (pEVar7->type).id = 0;
    pEVar7->_id = MemoryFillId;
    *(Expression **)(pEVar7 + 1) = pEVar4;
    pEVar7[1].type.id = (uintptr_t)pEVar5;
    *(Expression **)(pEVar7 + 2) = pEVar6;
    pEVar7[2].type.id = uVar2;
    *(uintptr_t *)(pEVar7 + 3) = uVar3;
    wasm::MemoryFill::finalize();
    return pEVar7;
  }
  pEVar4 = makeTrivial(this,(Type)0x0);
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryFill() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Expression* dest = makePointer();
  Expression* value = make(Type::i32);
  Expression* size = make(wasm.memories[0]->addressType);
  return builder.makeMemoryFill(dest, value, size, wasm.memories[0]->name);
}